

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findkey.c
# Opt level: O2

LispPTR N_OP_findkey(LispPTR tos,int byte)

{
  LispPTR *pLVar1;
  uint uVar2;
  LispPTR *pLVar3;
  
  if ((MachineState.pvar[-10] & 1) == 0) {
    pLVar1 = (LispPTR *)(MachineState.pvar + -0x10);
  }
  else {
    pLVar1 = (LispPTR *)((ulong)((uint)(ushort)(MachineState.pvar[-1] - 4) * 2) + (long)Stackspace);
  }
  uVar2 = byte + 1;
  pLVar3 = (LispPTR *)(MachineState.ivar + (long)(byte * 2) + -2);
  while( true ) {
    if (pLVar1 < pLVar3) {
      return 0;
    }
    if (*pLVar3 == tos) break;
    pLVar3 = pLVar3 + 2;
    uVar2 = uVar2 + 2;
  }
  return uVar2 & 0xffff | 0xe0000;
}

Assistant:

LispPTR N_OP_findkey(LispPTR tos, int byte) {
  LispPTR *ptr;
  DLword *find_end;
  DLword arg_nth;

#ifdef TRACE
  printPC();
  printf("TRACE : N_OP_findkey \n");
#endif

  if (CURRENTFX->alink & 1) { /* slow case */
    find_end = NativeAligned2FromStackOffset(CURRENTFX->blink - 4);
  } else { /*  Fast cae */
    find_end = ((DLword *)CURRENTFX) - 2 - 4;
  }

  arg_nth = byte + 1;

  for (ptr = (LispPTR *)(IVar + ((byte * 2) - 2)); (UNSIGNED)find_end >= (UNSIGNED)ptr;
       ptr += 2, arg_nth += 2) {
    if (*ptr == tos) { /* KEY founded */
      return (S_POSITIVE | arg_nth);
    }
  } /* for end */

  /* No matched */

  return (NIL_PTR);

}